

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadZero
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  Name memory;
  Type this_00;
  Index bytes;
  undefined4 uVar1;
  Address AVar2;
  long lVar3;
  LaneArray<4> local_160;
  Literal local_100;
  Literal local_e8;
  Literal local_d0;
  undefined1 local_b8 [8];
  Flow flow;
  Literal val;
  Literal zero;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_b8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)&zero.type,this,(Name)(curr->memory).super_IString.str);
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    AVar2 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)zero.type.id,memory);
    this_00 = zero.type;
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_b8 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    Literal::Literal(&local_100,(Literal *)&flow);
    bytes = SIMDLoad::getMemBytes(curr);
    AVar2 = getFinalAddress<wasm::SIMDLoad>
                      ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00.id,curr,&local_100,bytes,
                       AVar2);
    Literal::~Literal(&local_100);
    Literal::makeZero((Literal *)&val.type,(Type)((ulong)(curr->op == Load32ZeroVec128) ^ 3));
    if (curr->op == Load32ZeroVec128) {
      uVar1 = (**(code **)(**(long **)(zero.type.id + 0x288) + 0x90))
                        (*(long **)(zero.type.id + 0x288),AVar2.addr,info.instance,
                         info.name.super_IString.str._M_len);
      flow.breakTo.super_IString.str._M_str =
           (char *)CONCAT44(flow.breakTo.super_IString.str._M_str._4_4_,uVar1);
      val.field_0.func.super_IString.str._M_str = (char *)0x2;
      Literal::Literal(local_160._M_elems,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Literal::Literal(local_160._M_elems + 1,(Literal *)&val.type);
      Literal::Literal(local_160._M_elems + 2,(Literal *)&val.type);
      Literal::Literal(local_160._M_elems + 3,(Literal *)&val.type);
      Literal::Literal(&local_e8,&local_160);
      Flow::Flow(__return_storage_ptr__,&local_e8);
      Literal::~Literal(&local_e8);
      lVar3 = 0x48;
      do {
        Literal::~Literal((Literal *)((long)&local_160._M_elems[0].field_0 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
    }
    else {
      flow.breakTo.super_IString.str._M_str =
           (char *)(**(code **)(**(long **)(zero.type.id + 0x288) + 0xa0))
                             (*(long **)(zero.type.id + 0x288),AVar2.addr,info.instance,
                              info.name.super_IString.str._M_len);
      val.field_0.func.super_IString.str._M_str = (char *)0x3;
      Literal::Literal(local_160._M_elems,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Literal::Literal(local_160._M_elems + 1,(Literal *)&val.type);
      Literal::Literal(&local_d0,(LaneArray<2> *)&local_160);
      Flow::Flow(__return_storage_ptr__,&local_d0);
      Literal::~Literal(&local_d0);
      lVar3 = 0x18;
      do {
        Literal::~Literal((Literal *)((long)&local_160._M_elems[0].field_0 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
    }
    Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
    Literal::~Literal((Literal *)&val.type);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_b8;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadZero(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address src = info.instance->getFinalAddress(
      curr, flow.getSingleValue(), curr->getMemBytes(), memorySize);
    auto zero =
      Literal::makeZero(curr->op == Load32ZeroVec128 ? Type::i32 : Type::i64);
    if (curr->op == Load32ZeroVec128) {
      auto val =
        Literal(info.instance->externalInterface->load32u(src, info.name));
      return Literal(std::array<Literal, 4>{{val, zero, zero, zero}});
    } else {
      auto val =
        Literal(info.instance->externalInterface->load64u(src, info.name));
      return Literal(std::array<Literal, 2>{{val, zero}});
    }
  }